

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.cc
# Opt level: O1

v_field ConstTpl::readHandleSelector(string *name)

{
  int iVar1;
  v_field vVar2;
  LowlevelError *this;
  string local_40;
  
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    vVar2 = v_space;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 == 0) {
      vVar2 = v_offset;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)name);
      if (iVar1 == 0) {
        vVar2 = v_size;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)name);
        vVar2 = v_offset_plus;
        if (iVar1 != 0) {
          this = (LowlevelError *)__cxa_allocate_exception(0x20);
          local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_40,"Bad handle selector","");
          LowlevelError::LowlevelError(this,&local_40);
          __cxa_throw(this,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
        }
      }
    }
  }
  return vVar2;
}

Assistant:

ConstTpl::v_field ConstTpl::readHandleSelector(const string &name)

{
  if (name == "space")
    return v_space;
  if (name == "offset")
    return v_offset;
  if (name == "size")
    return v_size;
  if (name == "offset_plus")
    return v_offset_plus;
  throw LowlevelError("Bad handle selector");
}